

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O3

int64_t __thiscall obx::Transaction::getDataSizeChange(Transaction *this)

{
  int err;
  int64_t sizeChange;
  int64_t local_8;
  
  local_8 = 0;
  if (this->cTxn_ == (OBX_txn *)0x0) {
    internal::throwIllegalStateException("State condition failed: ","cTxn_");
  }
  err = obx_txn_data_size(this->cTxn_,0,&local_8);
  if (err == 0) {
    return local_8;
  }
  internal::throwLastError(err,(char *)0x0);
}

Assistant:

int64_t Transaction::getDataSizeChange() const {
    int64_t sizeChange = 0;
    internal::checkErrOrThrow(obx_txn_data_size(cPtr(), nullptr, &sizeChange));
    return sizeChange;
}